

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

bool __thiscall
slang::IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u>::iterator::
overflow<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
          (iterator *this,uint32_t level,allocator_type *alloc)

{
  NodeRef node;
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t *puVar5;
  NodeRef this_00;
  ulong uVar6;
  BranchNode<unsigned_long,_8U,_false> *pBVar7;
  NodeRef NVar8;
  IndexPair this_01;
  uint32_t in_ESI;
  PoolAllocator<char,_192UL,_64UL> *in_RDI;
  interval<unsigned_long> ival;
  uint32_t pos;
  bool split;
  int delta_1;
  uint32_t m_1;
  uint32_t n_1;
  int delta;
  int m;
  uint32_t n;
  IndexPair newOffset;
  uint32_t newSizes [4];
  uint32_t newNode;
  NodeRef rightSib;
  NodeRef leftSib;
  uint32_t curSizes [4];
  BranchNode<unsigned_long,_8U,_false> *nodes [4];
  uint32_t numNodes;
  uint32_t numElems;
  uint32_t offset;
  Path *path;
  undefined4 in_stack_ffffffffffffff08;
  uint32_t in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  uint32_t in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff2c;
  interval<unsigned_long> in_stack_ffffffffffffff30;
  uint local_c0;
  bool local_b9;
  uint local_b4;
  uint local_b0;
  int local_a8;
  uint uVar9;
  uint local_98 [4];
  allocator_type *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar10;
  uint32_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 auStack_58 [5];
  uint local_2c;
  uint32_t local_28;
  uint32_t local_24;
  FreeNode **local_20;
  uint32_t local_c;
  
  local_20 = &in_RDI->freeList;
  local_c = in_ESI;
  puVar5 = IntervalMapDetails::Path::offset
                     ((Path *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      in_stack_ffffffffffffff0c);
  local_24 = *puVar5;
  local_28 = 0;
  local_2c = 0;
  this_00 = IntervalMapDetails::Path::getLeftSibling
                      ((Path *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       (uint32_t)((ulong)in_RDI >> 0x20));
  bVar2 = IntervalMapDetails::NodeRef::operator_cast_to_bool((NodeRef *)0x10c791a);
  if (bVar2) {
    in_stack_ffffffffffffff98 = IntervalMapDetails::NodeRef::size((NodeRef *)0x10c792d);
    local_24 = in_stack_ffffffffffffff98 + local_24;
    local_28 = in_stack_ffffffffffffff98;
    pBVar7 = IntervalMapDetails::NodeRef::
             get<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                       ((NodeRef *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    uVar6 = (ulong)local_2c;
    local_2c = local_2c + 1;
    auStack_58[uVar6] = pBVar7;
  }
  uVar3 = IntervalMapDetails::Path::size
                    ((Path *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff0c);
  *(uint32_t *)((long)auStack_58 + (ulong)local_2c * 4 + -0x10) = uVar3;
  local_28 = uVar3 + local_28;
  pBVar7 = IntervalMapDetails::Path::
           node<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                     ((Path *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      in_stack_ffffffffffffff0c);
  uVar6 = (ulong)local_2c;
  local_2c = local_2c + 1;
  auStack_58[uVar6] = pBVar7;
  NVar8 = IntervalMapDetails::Path::getRightSibling
                    ((Path *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     (uint32_t)((ulong)in_RDI >> 0x20));
  bVar2 = IntervalMapDetails::NodeRef::operator_cast_to_bool((NodeRef *)0x10c7a0a);
  if (bVar2) {
    uVar3 = IntervalMapDetails::NodeRef::size((NodeRef *)0x10c7a1d);
    *(uint32_t *)((long)auStack_58 + (ulong)local_2c * 4 + -0x10) = uVar3;
    local_28 = uVar3 + local_28;
    pBVar7 = IntervalMapDetails::NodeRef::
             get<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                       ((NodeRef *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    uVar10 = local_2c;
    local_2c = local_2c + 1;
    auStack_58[uVar10] = pBVar7;
  }
  uVar10 = 0;
  if (local_2c << 3 < local_28 + 1) {
    if (local_2c == 1) {
      in_stack_ffffffffffffff1c = 1;
    }
    else {
      in_stack_ffffffffffffff1c = local_2c - 1;
    }
    *(undefined4 *)((long)auStack_58 + (ulong)local_2c * 4 + -0x10) =
         *(undefined4 *)((long)auStack_58 + (ulong)in_stack_ffffffffffffff1c * 4 + -0x10);
    auStack_58[local_2c] = auStack_58[in_stack_ffffffffffffff1c];
    *(undefined4 *)((long)auStack_58 + (ulong)in_stack_ffffffffffffff1c * 4 + -0x10) = 0;
    uVar10 = in_stack_ffffffffffffff1c;
    pBVar7 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>(in_RDI);
    auStack_58[uVar10] = pBVar7;
    local_2c = local_2c + 1;
  }
  this_01 = IntervalMapDetails::distribute
                      (in_stack_ffffffffffffff30.right._4_4_,
                       (uint32_t)in_stack_ffffffffffffff30.right,
                       in_stack_ffffffffffffff30.left._4_4_,
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       (uint32_t)((ulong)in_RDI >> 0x20));
  uVar9 = local_2c;
  do {
    do {
      uVar1 = uVar9;
      uVar9 = uVar1 - 1;
      if (uVar9 == 0) {
        local_b0 = 0;
        uVar3 = 0;
        do {
          if (local_2c - 1 <= local_b0) {
            bVar2 = IntervalMapDetails::NodeRef::operator_cast_to_bool((NodeRef *)0x10c7d73);
            if (bVar2) {
              IntervalMapDetails::Path::moveLeft((Path *)this_01,uVar3);
            }
            local_b9 = false;
            local_c0 = 0;
            while( true ) {
              if ((uVar10 == 0) || (local_c0 != uVar10)) {
                IntervalMapDetails::Path::setSize
                          ((Path *)in_RDI,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
                IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::iterator::
                recomputeBounds((iterator *)this_01,uVar3);
              }
              else {
                in_stack_ffffffffffffff30 =
                     IntervalMapDetails::
                     NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
                     ::getBounds((NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
                                  *)in_stack_ffffffffffffff30.left,in_stack_ffffffffffffff2c);
                in_stack_ffffffffffffff18 = local_c;
                IntervalMapDetails::NodeRef::
                NodeRef<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                          ((NodeRef *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           (BranchNode<unsigned_long,_8U,_false> *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0);
                node.pip.value._4_4_ = in_stack_ffffffffffffff9c;
                node.pip.value._0_4_ = in_stack_ffffffffffffff98;
                local_b9 = IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::iterator
                           ::insertNode((iterator *)this_00.pip.value,
                                        (uint32_t)((ulong)NVar8.pip.value >> 0x20),node,
                                        (interval<unsigned_long> *)
                                        CONCAT44(uVar10,in_stack_ffffffffffffff80),
                                        in_stack_ffffffffffffff78);
                if (local_b9) {
                  local_c = local_c + 1;
                }
              }
              if (local_c0 + 1 == local_2c) break;
              IntervalMapDetails::Path::moveRight((Path *)this_01,uVar3);
              local_c0 = local_c0 + 1;
            }
            for (; local_c0 != this_01.first; local_c0 = local_c0 - 1) {
              IntervalMapDetails::Path::moveLeft((Path *)this_01,uVar3);
            }
            uVar10 = this_01.second;
            puVar5 = IntervalMapDetails::Path::offset
                               ((Path *)CONCAT44(uVar10,in_stack_ffffffffffffff10),
                                in_stack_ffffffffffffff0c);
            *puVar5 = uVar10;
            return local_b9;
          }
          local_b4 = local_b0;
          if (*(uint *)((long)auStack_58 + (ulong)local_b0 * 4 + -0x10) != local_98[local_b0]) {
            do {
              local_b4 = local_b4 + 1;
              if (local_2c <= local_b4) break;
              iVar4 = IntervalMapDetails::
                      NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                      ::adjustFromLeftSib((NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                                           *)in_stack_ffffffffffffff30.right,
                                          in_stack_ffffffffffffff30.left._4_4_,
                                          (NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                                           *)CONCAT44(in_stack_ffffffffffffff2c,
                                                      in_stack_ffffffffffffff28),
                                          (uint32_t)((ulong)in_RDI >> 0x20),(int)in_RDI);
              *(int *)((long)auStack_58 + (ulong)local_b4 * 4 + -0x10) =
                   *(int *)((long)auStack_58 + (ulong)local_b4 * 4 + -0x10) + iVar4;
              *(int *)((long)auStack_58 + (ulong)local_b0 * 4 + -0x10) =
                   *(int *)((long)auStack_58 + (ulong)local_b0 * 4 + -0x10) - iVar4;
            } while (*(uint *)((long)auStack_58 + (ulong)local_b0 * 4 + -0x10) < local_98[local_b0])
            ;
          }
          local_b0 = local_b0 + 1;
        } while( true );
      }
    } while (*(uint *)((long)auStack_58 + (ulong)uVar9 * 4 + -0x10) == local_98[uVar9]);
    for (local_a8 = uVar1 - 2; local_a8 != -1; local_a8 = local_a8 + -1) {
      iVar4 = IntervalMapDetails::
              NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
              ::adjustFromLeftSib((NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                                   *)in_stack_ffffffffffffff30.right,
                                  in_stack_ffffffffffffff30.left._4_4_,
                                  (NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                                   *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                  (uint32_t)((ulong)in_RDI >> 0x20),(int)in_RDI);
      *(int *)((long)auStack_58 + (long)local_a8 * 4 + -0x10) =
           *(int *)((long)auStack_58 + (long)local_a8 * 4 + -0x10) - iVar4;
      *(int *)((long)auStack_58 + (ulong)uVar9 * 4 + -0x10) =
           *(int *)((long)auStack_58 + (ulong)uVar9 * 4 + -0x10) + iVar4;
      if (local_98[uVar9] <= *(uint *)((long)auStack_58 + (ulong)uVar9 * 4 + -0x10)) break;
    }
  } while( true );
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::overflow(uint32_t level, allocator_type& alloc) {
    SLANG_ASSERT(level > 0);
    using namespace IntervalMapDetails;

    auto& path = this->path;
    uint32_t offset = path.offset(level);
    uint32_t numElems = 0;
    uint32_t numNodes = 0;
    TNode* nodes[4];
    uint32_t curSizes[4];

    // Handle left sibling, if it exists.
    NodeRef leftSib = path.getLeftSibling(level);
    if (leftSib) {
        numElems = curSizes[0] = leftSib.size();
        offset += numElems;
        nodes[numNodes++] = &leftSib.get<TNode>();
    }

    // Handle the current node.
    numElems += curSizes[numNodes] = path.size(level);
    nodes[numNodes++] = &path.template node<TNode>(level);

    // Handle right sibling, if it exists.
    NodeRef rightSib = path.getRightSibling(level);
    if (rightSib) {
        numElems += curSizes[numNodes] = rightSib.size();
        nodes[numNodes++] = &rightSib.get<TNode>();
    }

    // Check if we need to allocate a new node.
    uint32_t newNode = 0;
    if (numElems + 1 > numNodes * TNode::Capacity) {
        // Insert new node at the penultimate position, or after a single node if only one.
        newNode = numNodes == 1 ? 1 : numNodes - 1;
        curSizes[numNodes] = curSizes[newNode];
        nodes[numNodes] = nodes[newNode];
        curSizes[newNode] = 0;
        nodes[newNode] = alloc.template emplace<TNode>();
        numNodes++;
    }

    // Redistribute elements among the nodes.
    uint32_t newSizes[4];
    IndexPair newOffset = distribute(numNodes, numElems, TNode::Capacity, newSizes, offset);

    // Move elements right.
    for (uint32_t n = numNodes - 1; n; --n) {
        if (curSizes[n] == newSizes[n])
            continue;

        for (int m = int(n - 1); m != -1; --m) {
            int delta = nodes[n]->adjustFromLeftSib(curSizes[n], *nodes[m], curSizes[m],
                                                    int(newSizes[n]) - int(curSizes[n]));
            curSizes[m] = uint32_t(int(curSizes[m]) - delta);
            curSizes[n] = uint32_t(int(curSizes[n]) + delta);

            // If the current node was exhausted we can bail out.
            if (curSizes[n] >= newSizes[n])
                break;
        }
    }

    // Move elements left.
    for (uint32_t n = 0; n < numNodes - 1; n++) {
        if (curSizes[n] == newSizes[n])
            continue;

        for (uint32_t m = n + 1; m < numNodes; m++) {
            int delta = nodes[m]->adjustFromLeftSib(curSizes[m], *nodes[n], curSizes[n],
                                                    int(curSizes[n]) - int(newSizes[n]));
            curSizes[m] = uint32_t(int(curSizes[m]) + delta);
            curSizes[n] = uint32_t(int(curSizes[n]) - delta);

            // If the current node was exhausted we can bail out.
            if (curSizes[n] >= newSizes[n])
                break;
        }
    }

    // Move the path to the leftmost node.
    if (leftSib)
        path.moveLeft(level);

    // Elements have been moved, update node sizes and interval bounds.
    bool split = false;
    uint32_t pos = 0;
    while (true) {
        if (newNode && pos == newNode) {
            // Actually insert the new node that we created earlier.
            auto ival = nodes[pos]->getBounds(newSizes[pos]);
            split = insertNode(level, NodeRef(nodes[pos], newSizes[pos]), ival, alloc);
            if (split)
                level++;
        }
        else {
            // Otherwise just update the size and bounds.
            path.setSize(level, newSizes[pos]);
            recomputeBounds(level);
        }

        if (pos + 1 == numNodes)
            break;

        path.moveRight(level);
        ++pos;
    }

    // Move our path to the new offset of the element we used to be pointing at.
    while (pos != newOffset.first) {
        path.moveLeft(level);
        --pos;
    }

    path.offset(level) = newOffset.second;
    return split;
}